

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-license.cpp
# Opt level: O2

void generate_license(string *fname,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *other_args)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  char **argv;
  ulong uVar4;
  ulong uVar5;
  pointer pbVar6;
  int sectionSize;
  SI_Error rc;
  undefined4 local_150;
  int retCode;
  undefined1 local_148 [32];
  _Rb_tree_node_base local_128;
  size_t local_108;
  _List_node_base local_100;
  undefined7 local_f0;
  undefined4 uStack_e9;
  bool local_e5;
  int local_e4;
  undefined8 local_e0;
  undefined1 local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  pbVar6 = (other_args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(other_args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6;
  uVar5 = lVar3 >> 5;
  lVar3 = lVar3 * 0x8000000 + 0x500000000;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar3) {
    uVar4 = lVar3 >> 0x1d;
  }
  argv = (char **)operator_new__(uVar4);
  *argv = "lic-generator";
  uVar2 = 3;
  while( true ) {
    uVar4 = (ulong)(uVar2 - 2);
    if (uVar5 < uVar4) break;
    argv[uVar4] = (pbVar6->_M_dataplus)._M_p;
    uVar2 = uVar2 + 1;
    pbVar6 = pbVar6 + 1;
  }
  argv[uVar4] = "-o";
  argv[uVar2 - 1] = (fname->_M_dataplus)._M_p;
  argv[uVar2] = "TEST";
  retCode = license::LicenseGenerator::generateLicense((int)uVar5 + 4,argv);
  operator_delete__(argv);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x20);
  local_148._8_8_ = local_148._8_8_ & 0xffffffffffffff00;
  local_148._0_8_ = &PTR__lazy_ostream_00633598;
  local_148._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_148._24_8_ = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_58 = "";
  local_e0 = (undefined **)((ulong)local_e0._4_4_ << 0x20);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_148,&local_60,0x20,1,2,&retCode,"retCode",&local_e0,"0");
  std::__cxx11::string::string((string *)local_148,(string *)fname);
  bVar1 = boost::filesystem::exists((path *)local_148);
  if (bVar1) {
    std::__cxx11::string::~string((string *)local_148);
    local_128._M_left = &local_128;
    local_128._M_color = _S_red;
    local_128._M_parent = (_Base_ptr)0x0;
    local_148._0_8_ = (char *)0x0;
    local_148._8_8_ = 0;
    local_148._16_8_ = (char *)0x0;
    local_108 = 0;
    local_100._M_next = &local_100;
    local_f0 = 0;
    uStack_e9 = 0;
    local_e5 = true;
    local_e4 = 0;
    local_128._M_right = local_128._M_left;
    local_100._M_prev = local_100._M_next;
    rc = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
                   ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_148,
                    (fname->_M_dataplus)._M_p);
    local_70 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
    ;
    local_68 = "";
    local_80 = &boost::unit_test::basic_cstring<char_const>::null;
    local_78 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x24);
    local_d8 = 0;
    local_e0 = &PTR__lazy_ostream_00633598;
    local_d0 = boost::unit_test::lazy_ostream::inst;
    local_c8 = "";
    local_90 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
    ;
    local_88 = "";
    sectionSize = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ge_impl,SI_Error,int>
              (&local_e0,&local_90,0x24,1,7,&rc,"rc",&sectionSize,"0");
    sectionSize = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSectionSize
                            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
                             local_148,"TEST");
    local_a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
    ;
    local_98 = "";
    local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x26);
    local_d8 = 0;
    local_e0 = &PTR__lazy_ostream_00633598;
    local_d0 = boost::unit_test::lazy_ostream::inst;
    local_c8 = "";
    local_c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
    ;
    local_b8 = "";
    local_150 = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::gt_impl,int,int>
              (&local_e0,&local_c0,0x26,1,6,&sectionSize,"sectionSize",&local_150,"0");
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
              ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_148);
    return;
  }
  __assert_fail("fs::exists(fname)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
                ,0x21,"void generate_license(const string &, const vector<string> &)");
}

Assistant:

void generate_license(const string& fname, const vector<string>& other_args) {
	int argc = 4+other_args.size();
	const char** argv = new const char*[argc + 1];
	unsigned int i=0;
	argv[i++] = "lic-generator";
	for(;i<=other_args.size();i++){
		argv[i] = other_args[i-1].c_str();
	}
	argv[i++] = "-o";
	argv[i++] = fname.c_str();
	argv[i++] = "TEST";
	int retCode = LicenseGenerator::generateLicense(argc, argv);
	delete[] (argv);
	BOOST_CHECK_EQUAL(retCode, 0);
	BOOST_ASSERT(fs::exists(fname));
	CSimpleIniA ini;
	SI_Error rc = ini.LoadFile(fname.c_str());
	BOOST_CHECK_GE(rc,0);
	int sectionSize = ini.GetSectionSize("TEST");
	BOOST_CHECK_GT(sectionSize,0);
}